

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSAttribute.cpp
# Opt level: O1

void __thiscall OSAttribute::OSAttribute(OSAttribute *this,unsigned_long value)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_OSAttribute = (_func_int **)&PTR__OSAttribute_0019c810;
  ByteString::ByteString(&this->byteStrValue);
  p_Var1 = &(this->mechSetValue)._M_t._M_impl.super__Rb_tree_header;
  (this->mechSetValue)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mechSetValue)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mechSetValue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mechSetValue)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mechSetValue)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->attrMapValue)._M_t._M_impl.super__Rb_tree_header;
  (this->attrMapValue)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->attrMapValue)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->attrMapValue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->attrMapValue)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->attrMapValue)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->ulongValue = value;
  this->attributeType = ULONG;
  this->boolValue = false;
  return;
}

Assistant:

OSAttribute::OSAttribute(const unsigned long value)
{
	ulongValue = value;
	attributeType = ULONG;

	boolValue = false;
}